

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlNodeRemoveNsDef(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_60;
  xmlNsPtr c_retval;
  xmlChar *href;
  PyObject *pyobj_node;
  xmlNodePtr node;
  xmlNsPtr prev;
  xmlNsPtr ns;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"Oz:xmlNodeRemoveNsDef",&href,&c_retval);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (href == &_Py_NoneStruct) {
      local_60 = (PyObject *)0x0;
    }
    else {
      local_60 = *(PyObject **)(href + 0x10);
    }
    pyobj_node = local_60;
    prev = (xmlNsPtr)0x0;
    if ((local_60 == (PyObject *)0x0) || (*(int *)&local_60->ob_type != 1)) {
      _Py_INCREF((PyObject *)&_Py_NoneStruct);
      self_local = (PyObject *)&_Py_NoneStruct;
    }
    else {
      if (c_retval == (xmlNsPtr)0x0) {
        prev = (xmlNsPtr)local_60[6].ob_refcnt;
        local_60[6].ob_refcnt = 0;
      }
      else {
        node = (xmlNodePtr)0x0;
        for (prev = (xmlNsPtr)local_60[6].ob_refcnt; prev != (xmlNsPtr)0x0; prev = prev->next) {
          iVar1 = xmlStrEqual(prev->href,c_retval);
          if (iVar1 != 0) {
            if (node == (xmlNodePtr)0x0) {
              pyobj_node[6].ob_refcnt = (Py_ssize_t)prev->next;
            }
            else {
              node->_private = prev->next;
            }
            prev->next = (_xmlNs *)0x0;
            break;
          }
          node = (xmlNodePtr)prev;
        }
      }
      self_local = libxml_xmlNsPtrWrap(prev);
    }
  }
  return self_local;
}

Assistant:

PyObject *
libxml_xmlNodeRemoveNsDef(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *py_retval;
    xmlNsPtr ns, prev;
    xmlNodePtr node;
    PyObject *pyobj_node;
    xmlChar *href;
    xmlNsPtr c_retval;

    if (!PyArg_ParseTuple
        (args, (char *) "Oz:xmlNodeRemoveNsDef", &pyobj_node, &href))
        return (NULL);
    node = (xmlNodePtr) PyxmlNode_Get(pyobj_node);
    ns = NULL;

    if ((node == NULL) || (node->type != XML_ELEMENT_NODE)) {
        Py_INCREF(Py_None);
        return (Py_None);
    }

    if (href == NULL) {
	ns = node->nsDef;
	node->nsDef = NULL;
	c_retval = 0;
    }
    else {
	prev = NULL;
	ns = node->nsDef;
	while (ns != NULL) {
	    if (xmlStrEqual(ns->href, href)) {
		if (prev != NULL)
		    prev->next = ns->next;
		else
		    node->nsDef = ns->next;
		ns->next = NULL;
		c_retval = 0;
		break;
	    }
	    prev = ns;
	    ns = ns->next;
	}
    }

    c_retval = ns;
    py_retval = libxml_xmlNsPtrWrap((xmlNsPtr) c_retval);
    return (py_retval);
}